

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O2

bool draco::anon_unknown_14::DecodeVarintUnsigned<unsigned_int>
               (int depth,uint *out_val,DecoderBuffer *buffer)

{
  bool bVar1;
  uint uVar2;
  uint8_t in;
  byte local_19;
  
  if (5 < (uint)depth) {
    return false;
  }
  bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&local_19);
  if (bVar1) {
    uVar2 = (uint)(char)local_19;
    if ((char)local_19 < '\0') {
      bVar1 = DecodeVarintUnsigned<unsigned_int>(depth + 1,out_val,buffer);
      if (!bVar1) goto LAB_001506d8;
      uVar2 = local_19 & 0x7f | *out_val << 7;
    }
    *out_val = uVar2;
    bVar1 = true;
  }
  else {
LAB_001506d8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DecodeVarintUnsigned(int depth, IntTypeT *out_val, DecoderBuffer *buffer) {
  constexpr IntTypeT max_depth = sizeof(IntTypeT) + 1 + (sizeof(IntTypeT) >> 3);
  if (depth > max_depth) {
    return false;
  }
  // Coding of unsigned values.
  // 0-6 bit - data
  // 7 bit - next byte?
  uint8_t in;
  if (!buffer->Decode(&in)) {
    return false;
  }
  if (in & (1 << 7)) {
    // Next byte is available, decode it first.
    if (!DecodeVarintUnsigned<IntTypeT>(depth + 1, out_val, buffer)) {
      return false;
    }
    // Append decoded info from this byte.
    *out_val <<= 7;
    *out_val |= in & ((1 << 7) - 1);
  } else {
    // Last byte reached
    *out_val = in;
  }
  return true;
}